

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O0

void Abc_ObjFaninFlipPhase(Abc_Obj_t *p,int i)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint i_00;
  uint *puVar2;
  int i_local;
  Abc_Obj_t *p_local;
  
  if (p->pNtk->vPhases == (Vec_Int_t *)0x0) {
    __assert_fail("p->pNtk->vPhases",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x18b,"void Abc_ObjFaninFlipPhase(Abc_Obj_t *, int)");
  }
  if (-1 < i) {
    iVar1 = Abc_ObjFaninNum(p);
    if (i < iVar1) {
      p_00 = p->pNtk->vPhases;
      i_00 = Abc_ObjId(p);
      puVar2 = (uint *)Vec_IntEntryP(p_00,i_00);
      *puVar2 = 1 << ((byte)i & 0x1f) ^ *puVar2;
      return;
    }
  }
  __assert_fail("i >= 0 && i < Abc_ObjFaninNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x18b,"void Abc_ObjFaninFlipPhase(Abc_Obj_t *, int)");
}

Assistant:

static inline void        Abc_ObjFaninFlipPhase( Abc_Obj_t * p,int i){ assert(p->pNtk->vPhases); assert( i >= 0 && i < Abc_ObjFaninNum(p) ); *Vec_IntEntryP(p->pNtk->vPhases, Abc_ObjId(p)) ^= (1 << i);      }